

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

int __thiscall
Protocol::MQTT::V5::Property<unsigned_short>::clone
          (Property<unsigned_short> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...
          )

{
  unsigned_short uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  uVar1 = (this->value).value;
  *(uint8 *)(puVar2 + 1) = (this->super_PropertyBaseImpl).super_PropertyBase.type;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 1;
  puVar2[4] = puVar2 + 5;
  *puVar2 = &PTR_getSize_0011f5d8;
  puVar2[5] = &PTR_typeSize_0011f648;
  *(unsigned_short *)(puVar2 + 6) = uVar1;
  return (int)puVar2;
}

Assistant:

PropertyBase * clone() const { return new Property((PropertyType)type, value.value, true); }